

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cl_generator.cc
# Opt level: O1

void __thiscall t_cl_generator::generate_enum(t_cl_generator *this,t_enum *tenum)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  long *plVar6;
  t_cl_generator *this_00;
  pointer pptVar7;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_90;
  t_cl_generator *local_70;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> local_68;
  string local_50;
  
  poVar1 = &this->f_types_;
  local_70 = this;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(thrift:def-enum ",0x11);
  iVar4 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  this_00 = *(t_cl_generator **)CONCAT44(extraout_var,iVar4);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,this_00,
             (long)&(this_00->super_t_oop_generator).super_t_generator._vptr_t_generator +
             ((long *)CONCAT44(extraout_var,iVar4))[1]);
  prefix(&local_90,this_00,&local_50);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector(&local_68,&tenum->constants_)
  ;
  piVar2 = &(local_70->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)local_70);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  cVar3 = (char)poVar1;
  pptVar7 = local_68.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_68.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar4 = (*pptVar7)->value_;
      if (pptVar7 !=
          local_68.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::ios::widen((char)(poVar1->super_ostringstream).
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                              [-3] + cVar3);
        std::ostream::put(cVar3);
        poVar5 = (ostream *)std::ostream::flush();
        t_generator::indent_abi_cxx11_(&local_90,(t_generator *)local_70);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(\"",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,((*pptVar7)->name_)._M_dataplus._M_p,
                          ((*pptVar7)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" . ",4);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             local_68.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar2 = &(local_70->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"))",2);
  std::ios::widen((char)(poVar1->super_ostringstream).
                        super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3] +
                  cVar3);
  std::ostream::put(cVar3);
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  if (local_68.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_cl_generator::generate_enum(t_enum* tenum) {
  f_types_ << "(thrift:def-enum " << prefix(tenum->get_name()) << endl;

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  int value = -1;

  indent_up();
  f_types_ << indent() << "(";
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    value = (*c_iter)->get_value();

    if(c_iter != constants.begin()) f_types_ << endl << indent() << " ";

    f_types_ << "(\"" << (*c_iter)->get_name() << "\" . " << value << ")";
  }
  indent_down();
  f_types_ << "))" << endl << endl;
}